

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t parse_htime_item(archive_read *a,char unix_time,uint64_t *where,ssize_t *extra_data_size)

{
  ulong uVar1;
  wchar_t wVar2;
  ulong *puVar3;
  uint32_t time_val;
  ssize_t avail;
  uint local_2c;
  ssize_t local_28;
  
  if (unix_time == '\0') {
    local_28 = -1;
    puVar3 = (ulong *)__archive_read_ahead(a,8,&local_28);
    if (puVar3 != (ulong *)0x0) {
      uVar1 = *puVar3;
      puVar3 = (ulong *)__archive_read_consume(a,8);
      if (puVar3 == (ulong *)0x8) {
        puVar3 = (ulong *)(uVar1 / 10000000 - 0x2b6109100);
        *where = (uint64_t)puVar3;
        *extra_data_size = *extra_data_size + -8;
      }
    }
  }
  else {
    wVar2 = read_u32(a,&local_2c);
    puVar3 = (ulong *)(ulong)(uint)wVar2;
    if (wVar2 != L'\0') {
      *extra_data_size = *extra_data_size + -4;
      puVar3 = (ulong *)(ulong)local_2c;
      *where = (uint64_t)puVar3;
    }
  }
  return (wchar_t)puVar3;
}

Assistant:

static int parse_htime_item(struct archive_read* a, char unix_time,
    uint64_t* where, ssize_t* extra_data_size)
{
	if(unix_time) {
		uint32_t time_val;
		if(!read_u32(a, &time_val))
			return ARCHIVE_EOF;

		*extra_data_size -= 4;
		*where = (uint64_t) time_val;
	} else {
		uint64_t windows_time;
		if(!read_u64(a, &windows_time))
			return ARCHIVE_EOF;

		*where = time_win_to_unix(windows_time);
		*extra_data_size -= 8;
	}

	return ARCHIVE_OK;
}